

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Num3(ByteCodeWriter *this,OpCode op,RegSlot C0,RegSlot C1,RegSlot C2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x4);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x99f,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007d07cb;
    *puVar3 = 0;
  }
  bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,C0,C1,C2);
  if (!bVar2) {
    bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,C0,C1,C2);
    if (!bVar2) {
      bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,C0,C1,C2);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x9a1,"(success)","success");
        if (!bVar2) {
LAB_007d07cb:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::Num3(OpCode op, RegSlot C0, RegSlot C1, RegSlot C2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(Reg3, op, C0, C1, C2);
    }